

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

void __thiscall ON_OBSOLETE_V5_Annotation::Destroy(ON_OBSOLETE_V5_Annotation *this)

{
  ON_2dPoint *__s;
  ON_AnnotationTextFormula *pOVar1;
  long lVar2;
  ON_Plane *pOVar3;
  ON_Plane *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  this->m_v5_3dm_archive_dimstyle_index = -1;
  __s = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
  if (__s != (ON_2dPoint *)0x0) {
    memset(__s,0,(long)(this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_capacity << 4);
  }
  (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  ON_wString::operator=(&(this->m_usertext).super_ON_wString,(wchar_t *)0x0);
  (this->m_usertext).m_rect.left = 0;
  (this->m_usertext).m_rect.top = 0;
  (this->m_usertext).m_rect.right = 0;
  (this->m_usertext).m_rect.bottom = 0;
  pOVar1 = ON_AnnotationTextFormula::Get(this);
  if (pOVar1 != (ON_AnnotationTextFormula *)0x0) {
    (*(pOVar1->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar1);
  }
  this->m_type = dtNothing;
  pOVar3 = &ON_xy_plane;
  pOVar4 = &this->m_plane;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar4->origin).x = (pOVar3->origin).x;
    pOVar3 = (ON_Plane *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  this->m_userpositionedtext = false;
  this->m_annotative_scale = true;
  this->m_justification = 0;
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Destroy()
{
  m_v5_3dm_archive_dimstyle_index = -1;

  // 10-27-03 LW memory leak prevention
  m_points.Empty();
  SetTextValue(0);
  SetTextFormula(0);
  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing;
  m_plane = ON_xy_plane;
  m_userpositionedtext = false;
  m_justification = 0;
  m_annotative_scale = true;
}